

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

ParamNames * __thiscall
deqp::gls::BuiltinPrecisionTests::
Func<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,2,4>,tcu::Matrix<float,2,4>,tcu::Matrix<float,2,4>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>
::doGetParamNames_abi_cxx11_
          (Func<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,2,4>,tcu::Matrix<float,2,4>,tcu::Matrix<float,2,4>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>
           *this)

{
  int iVar1;
  allocator<char> local_8c;
  allocator<char> local_8b;
  allocator<char> local_8a;
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  if (doGetParamNames[abi:cxx11]()::names_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&doGetParamNames[abi:cxx11]()::names_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"a",&local_89);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"b",&local_8a);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"c",&local_8b);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"d",&local_8c);
      Tuple4<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::Tuple4(&doGetParamNames[abi:cxx11]()::names_abi_cxx11_,&local_28,&local_48,&local_68,
               &local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_28);
      __cxa_atexit(Tuple4<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::~Tuple4,&doGetParamNames[abi:cxx11]()::names_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&doGetParamNames[abi:cxx11]()::names_abi_cxx11_);
    }
  }
  return &doGetParamNames[abi:cxx11]()::names_abi_cxx11_;
}

Assistant:

virtual const ParamNames&	doGetParamNames	(void)							const
	{
		static ParamNames	names	("a", "b", "c", "d");
		return names;
	}